

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 neon_get_scalar(TCGContext_conflict1 *tcg_ctx,int size,int reg)

{
  undefined8 local_20;
  TCGv_i32 tmp;
  int reg_local;
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 1) {
    local_20 = neon_load_reg(tcg_ctx,reg & 7,reg >> 4);
    if ((reg & 8U) == 0) {
      gen_neon_dup_low16(tcg_ctx,local_20);
    }
    else {
      gen_neon_dup_high16(tcg_ctx,local_20);
    }
  }
  else {
    local_20 = neon_load_reg(tcg_ctx,reg & 0xf,reg >> 4);
  }
  return local_20;
}

Assistant:

static inline TCGv_i32 neon_get_scalar(TCGContext *tcg_ctx, int size, int reg)
{
    TCGv_i32 tmp;
    if (size == 1) {
        tmp = neon_load_reg(tcg_ctx, reg & 7, reg >> 4);
        if (reg & 8) {
            gen_neon_dup_high16(tcg_ctx, tmp);
        } else {
            gen_neon_dup_low16(tcg_ctx, tmp);
        }
    } else {
        tmp = neon_load_reg(tcg_ctx, reg & 15, reg >> 4);
    }
    return tmp;
}